

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O3

void Memory::RecyclerWriteBarrierManager::WriteBarrier(void *address)

{
  bool bVar1;
  ulong uVar2;
  
  uVar2 = (ulong)address >> 0xc;
  if ((DAT_015bf41c == '\x01') && ((cardTable[uVar2] & 2) == 0)) {
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  cardTable[uVar2] = cardTable[uVar2] | 1;
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,SWBPhase);
  if ((bVar1) && (DAT_015bc46a == '\x01')) {
    Output::Print(L"Writing to 0x%p (CIndex: %u)\n",address,uVar2);
    return;
  }
  return;
}

Assistant:

void
RecyclerWriteBarrierManager::WriteBarrier(void * address)
{
    if (IS_ASAN_FAKE_STACK_ADDR(address))
    {
        return;
    }

#ifdef RECYCLER_WRITE_BARRIER_BYTE
#if ENABLE_DEBUG_CONFIG_OPTIONS
    VerifyIsBarrierAddress(address);
#endif
    const uintptr_t index = GetCardTableIndex(address);
    cardTable[index] |= DIRTYBIT;
#else
    uint bitShift = (((uint)address) >> s_BitArrayCardTableShift);
    uint bitMask = 1 << bitShift;
    const uint cardIndex = ((uint) address) / (s_BytesPerCard);
    cardTable[cardIndex] |= bitMask;
#endif
#if DBG_DUMP
    // Global to process, use global configuration here
    if (PHASE_VERBOSE_TRACE1(Js::SWBPhase))
    {
        Output::Print(_u("Writing to 0x%p (CIndex: %u)\n"), address, index);
    }
#endif
}